

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IGeneratorsForTest * __thiscall Catch::Context::getGeneratorsForCurrentTest(Context *this)

{
  int iVar1;
  undefined4 extraout_var;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>
  local_70;
  undefined1 local_38 [8];
  string testName;
  IGeneratorsForTest *generators;
  Context *this_local;
  
  testName.field_2._8_8_ = findGeneratorsForCurrentTest(this);
  if ((IGeneratorsForTest *)testName.field_2._8_8_ == (IGeneratorsForTest *)0x0) {
    iVar1 = (*(this->super_IMutableContext).super_IContext._vptr_IContext[2])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x40))(local_38);
    testName.field_2._8_8_ = createGeneratorsForTest();
    std::make_pair<std::__cxx11::string&,Catch::IGeneratorsForTest*&>
              (&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (IGeneratorsForTest **)((long)&testName.field_2 + 8));
    std::
    map<std::__cxx11::string,Catch::IGeneratorsForTest*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IGeneratorsForTest*>>>
    ::insert<std::pair<std::__cxx11::string,Catch::IGeneratorsForTest*>>
              ((map<std::__cxx11::string,Catch::IGeneratorsForTest*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IGeneratorsForTest*>>>
                *)&this->m_generatorsByTestName,&local_70);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>
    ::~pair(&local_70);
    std::__cxx11::string::~string((string *)local_38);
  }
  return (IGeneratorsForTest *)testName.field_2._8_8_;
}

Assistant:

IGeneratorsForTest& getGeneratorsForCurrentTest() {
            IGeneratorsForTest* generators = findGeneratorsForCurrentTest();
            if( !generators ) {
                std::string testName = getResultCapture()->getCurrentTestName();
                generators = createGeneratorsForTest();
                m_generatorsByTestName.insert( std::make_pair( testName, generators ) );
            }
            return *generators;
        }